

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O2

int magma_cipher_ctl_acpkm_omac(EVP_CIPHER_CTX *ctx,int type,int arg,void *ptr)

{
  int iVar1;
  long lVar2;
  long lVar3;
  EVP_MD_CTX *out;
  EVP_MD_CTX *in;
  
  if (type == 8) {
    lVar2 = EVP_CIPHER_CTX_get_cipher_data();
    lVar3 = EVP_CIPHER_CTX_get_cipher_data(ptr);
    in = *(EVP_MD_CTX **)(lVar2 + 0x1080);
    out = *(EVP_MD_CTX **)(lVar3 + 0x1080);
    if (in == out) {
      out = (EVP_MD_CTX *)EVP_MD_CTX_new();
      *(EVP_MD_CTX **)(lVar3 + 0x1080) = out;
      if (out == (EVP_MD_CTX *)0x0) {
        ERR_GOST_error(0xa4,0xc0100,
                       "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_crypt.c"
                       ,0x54c);
        return -1;
      }
      in = *(EVP_MD_CTX **)(lVar2 + 0x1080);
    }
    iVar1 = EVP_MD_CTX_copy(out,in);
    return iVar1;
  }
  if (type == 0x28) {
    lVar2 = EVP_CIPHER_CTX_get_cipher_data();
    iVar1 = gost2015_process_unprotected_attributes
                      ((stack_st_X509_ATTRIBUTE *)ptr,arg,8,(uchar *)(lVar2 + 0x14));
    return iVar1;
  }
  iVar1 = magma_cipher_ctl(ctx,type,arg,ptr);
  return iVar1;
}

Assistant:

static int magma_cipher_ctl_acpkm_omac(EVP_CIPHER_CTX *ctx, int type, int arg, void *ptr)
{
	switch (type)
	{
		case EVP_CTRL_PROCESS_UNPROTECTED:
		{
			struct ossl_gost_cipher_ctx *c = EVP_CIPHER_CTX_get_cipher_data(ctx);
			STACK_OF(X509_ATTRIBUTE) *x = ptr;
      return gost2015_process_unprotected_attributes(x, arg, MAGMA_MAC_MAX_SIZE, c->tag);
		}
    case EVP_CTRL_COPY: {
			EVP_CIPHER_CTX *out = ptr;
      struct ossl_gost_cipher_ctx *in_cctx  = EVP_CIPHER_CTX_get_cipher_data(ctx);
      struct ossl_gost_cipher_ctx *out_cctx = EVP_CIPHER_CTX_get_cipher_data(out);

			if (in_cctx->omac_ctx == out_cctx->omac_ctx) {
				out_cctx->omac_ctx = EVP_MD_CTX_new();
				if (out_cctx->omac_ctx == NULL) {
					GOSTerr(GOST_F_MAGMA_CIPHER_CTL_ACPKM_OMAC, ERR_R_MALLOC_FAILURE);
					return -1;
				}
			}
			return EVP_MD_CTX_copy(out_cctx->omac_ctx, in_cctx->omac_ctx);
		}
		default:
			return magma_cipher_ctl(ctx, type, arg, ptr);
			break;
	}
}